

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O0

void index_encoder_reset(lzma_index_coder *coder,lzma_index *i)

{
  lzma_index *i_local;
  lzma_index_coder *coder_local;
  
  lzma_index_iter_init(&coder->iter,i);
  coder->sequence = SEQ_INDICATOR;
  coder->index = i;
  coder->pos = 0;
  coder->crc32 = 0;
  return;
}

Assistant:

static void
index_encoder_reset(lzma_index_coder *coder, const lzma_index *i)
{
	lzma_index_iter_init(&coder->iter, i);

	coder->sequence = SEQ_INDICATOR;
	coder->index = i;
	coder->pos = 0;
	coder->crc32 = 0;

	return;
}